

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpsClient.cpp
# Opt level: O2

ssize_t __thiscall xmrig::HttpsClient::read(HttpsClient *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ssize_t extraout_RAX;
  undefined4 extraout_var_01;
  ssize_t extraout_RAX_00;
  undefined4 extraout_var_02;
  undefined4 in_register_00000034;
  uchar *in_R8;
  size_t in_R9;
  undefined1 auVar4 [16];
  ssize_t sVar3;
  
  BIO_write((BIO *)this->m_readBio,(void *)CONCAT44(in_register_00000034,__fd),(int)__buf);
  iVar1 = SSL_is_init_finished(this->m_ssl);
  if (iVar1 == 0) {
    iVar1 = SSL_connect((SSL *)this->m_ssl);
    sVar3 = CONCAT44(extraout_var_00,iVar1);
    if (iVar1 < 0) {
      iVar1 = SSL_get_error((SSL *)this->m_ssl,iVar1);
      sVar3 = CONCAT44(extraout_var_01,iVar1);
      if (iVar1 == 2) {
        flush(this);
        return extraout_RAX_00;
      }
    }
    else if (iVar1 == 1) {
      auVar4 = SSL_get1_peer_certificate(this->m_ssl);
      iVar1 = verify(this,(EVP_PKEY_CTX *)auVar4._0_8_,auVar4._8_8_,__nbytes,in_R8,in_R9);
      X509_free(auVar4._0_8_);
      if ((char)iVar1 != '\0') {
        this->m_ready = true;
        HttpClient::handshake(&this->super_HttpClient);
        return extraout_RAX;
      }
      iVar1 = HttpContext::close((HttpContext *)this,-0x47);
      return CONCAT44(extraout_var_02,iVar1);
    }
  }
  else {
    while( true ) {
      uVar2 = SSL_read((SSL *)this->m_ssl,this->m_buf,0x800);
      sVar3 = CONCAT44(extraout_var,uVar2);
      if ((int)uVar2 < 1) break;
      HttpClient::read(&this->super_HttpClient,(int)this->m_buf,(void *)(ulong)uVar2,__nbytes);
    }
  }
  return sVar3;
}

Assistant:

void xmrig::HttpsClient::read(const char *data, size_t size)
{
    BIO_write(m_readBio, data, size);

    if (!SSL_is_init_finished(m_ssl)) {
        const int rc = SSL_connect(m_ssl);

        if (rc < 0 && SSL_get_error(m_ssl, rc) == SSL_ERROR_WANT_READ) {
            flush();
        } else if (rc == 1) {
            X509 *cert = SSL_get_peer_certificate(m_ssl);
            if (!verify(cert)) {
                X509_free(cert);
                return close(UV_EPROTO);
            }

            X509_free(cert);
            m_ready = true;

            HttpClient::handshake();
      }

      return;
    }

    int bytes_read = 0;
    while ((bytes_read = SSL_read(m_ssl, m_buf, sizeof(m_buf))) > 0) {
        HttpClient::read(m_buf, static_cast<size_t>(bytes_read));
    }
}